

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

Cookie * Curl_cookie_add(Curl_easy *data,CookieInfo *c,_Bool httpheader,char *lineptr,char *domain,
                        char *path)

{
  char cVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  time_t tVar5;
  Cookie *pCVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  long lVar12;
  char *pcVar13;
  time_t tVar14;
  char cVar15;
  Cookie *pCVar16;
  Cookie *pCVar17;
  Cookie *pCVar18;
  uint uVar19;
  bool bVar20;
  bool bVar21;
  byte bVar22;
  char *local_470;
  in_addr addr;
  char name [1024];
  
  bVar22 = 0;
  tVar5 = time((time_t *)0x0);
  pCVar6 = (Cookie *)(*Curl_ccalloc)(1,0x60);
  if (pCVar6 == (Cookie *)0x0) {
    return (Cookie *)0x0;
  }
  if (httpheader) {
    pcVar7 = (char *)(*Curl_cmalloc)(5000);
    if (pcVar7 == (char *)0x0) {
LAB_0055cbfd:
      (*Curl_cfree)(pCVar6);
      return (Cookie *)0x0;
    }
    pcVar8 = strchr(lineptr,0x3b);
    for (; (*lineptr == '\t' || (*lineptr == ' ')); lineptr = lineptr + 1) {
    }
    local_470 = domain;
    bVar21 = false;
LAB_0055cc1c:
    *pcVar7 = '\0';
    name._0_8_ = name._0_8_ & 0xffffffffffffff00;
    iVar3 = __isoc99_sscanf(lineptr,"%1023[^;\r\n=] =%4999[^;\r\n]",name,pcVar7);
    if (iVar3 < 1) {
LAB_0055cf70:
      bVar20 = bVar21;
      if ((pcVar8 == (char *)0x0) || (lineptr = pcVar8, *pcVar8 == '\0')) goto LAB_0055d20c;
      do {
        do {
          lineptr = lineptr + 1;
          cVar1 = *lineptr;
        } while (cVar1 == ' ');
      } while (cVar1 == '\t');
      pcVar8 = strchr(lineptr,0x3b);
      bVar21 = bVar20;
      if (pcVar8 == (char *)0x0) {
        if (cVar1 == '\0') goto LAB_0055d20c;
        sVar9 = strlen(lineptr);
        pcVar8 = lineptr + sVar9;
      }
      goto LAB_0055cc1c;
    }
    sVar9 = strlen(pcVar7);
    sVar10 = strlen(name);
    cVar1 = lineptr[sVar10];
    if ((sVar10 != 0) && ((cVar15 = lineptr[sVar10 - 1], cVar15 == ' ' || (cVar15 == '\t')))) {
LAB_0055cc71:
      if (cVar15 != ' ') {
        if (((cVar15 == '\0') || (cVar15 != '\t')) || (sVar10 == 0)) goto LAB_0055cc9a;
LAB_0055cc8e:
        cVar15 = lineptr[sVar10 - 2];
        sVar10 = sVar10 - 1;
        goto LAB_0055cc71;
      }
      if (sVar10 != 0) goto LAB_0055cc8e;
      sVar10 = 0;
LAB_0055cc9a:
      name[sVar10] = '\0';
    }
    bVar20 = true;
    for (; pcVar13 = pcVar7, sVar9 != 0; sVar9 = sVar9 - 1) {
      if ((pcVar7[sVar9 - 1] != ' ') && (pcVar7[sVar9 - 1] != '\t')) {
        bVar20 = false;
        break;
      }
      pcVar7[sVar9 - 1] = '\0';
    }
    for (; (*pcVar13 == ' ' || (*pcVar13 == '\t')); pcVar13 = pcVar13 + 1) {
    }
    if ((pCVar6->name == (char *)0x0) && (cVar1 == '=')) {
      pcVar11 = (*Curl_cstrdup)(name);
      pCVar6->name = pcVar11;
      pcVar11 = (*Curl_cstrdup)(pcVar13);
      pCVar6->value = pcVar11;
      bVar20 = true;
      if ((pCVar6->name == (char *)0x0) || (pcVar11 == (char *)0x0)) goto LAB_0055d20c;
    }
    else if (bVar20) {
      iVar3 = Curl_strcasecompare("secure",name);
      if (iVar3 == 0) {
        iVar3 = Curl_strcasecompare("httponly",name);
        if (iVar3 == 0) {
          if (cVar1 == '=') goto LAB_0055cd72;
        }
        else {
          pCVar6->httponly = true;
        }
      }
      else {
        pCVar6->secure = true;
      }
      goto LAB_0055cf70;
    }
LAB_0055cd72:
    iVar3 = Curl_strcasecompare("path",name);
    if (iVar3 != 0) {
      (*Curl_cfree)(pCVar6->path);
      pcVar13 = (*Curl_cstrdup)(pcVar13);
      pCVar6->path = pcVar13;
      bVar20 = true;
      if (pcVar13 == (char *)0x0) goto LAB_0055d20c;
      pcVar13 = sanitize_cookie_path(pcVar13);
      pCVar6->spath = pcVar13;
      if (pcVar13 == (char *)0x0) goto LAB_0055d20c;
      goto LAB_0055cf70;
    }
    iVar3 = Curl_strcasecompare("domain",name);
    if (iVar3 == 0) {
      iVar3 = Curl_strcasecompare("version",name);
      if (iVar3 != 0) {
        (*Curl_cfree)(pCVar6->version);
        pcVar13 = (*Curl_cstrdup)(pcVar13);
        pCVar6->version = pcVar13;
        goto LAB_0055cf67;
      }
      iVar3 = Curl_strcasecompare("max-age",name);
      if (iVar3 == 0) {
        iVar3 = Curl_strcasecompare("expires",name);
        if (iVar3 != 0) {
          (*Curl_cfree)(pCVar6->expirestr);
          pcVar13 = (*Curl_cstrdup)(pcVar13);
          pCVar6->expirestr = pcVar13;
          goto LAB_0055cf67;
        }
      }
      else {
        (*Curl_cfree)(pCVar6->maxage);
        pcVar13 = (*Curl_cstrdup)(pcVar13);
        pCVar6->maxage = pcVar13;
        if (pcVar13 == (char *)0x0) {
          bVar20 = true;
          goto LAB_0055d5a9;
        }
      }
      goto LAB_0055cf70;
    }
    pcVar13 = pcVar13 + (*pcVar13 == '.');
    pcVar11 = strchr(pcVar13,0x2e);
    if ((pcVar11 == (char *)0x0) && (iVar3 = Curl_strcasecompare("localhost",pcVar13), iVar3 == 0))
    {
      local_470 = ":";
    }
    pcVar11 = local_470;
    if (local_470 == (char *)0x0) {
      pcVar11 = pcVar13;
    }
    iVar3 = inet_pton(2,pcVar11,&addr);
    if (local_470 != (char *)0x0) {
      if (iVar3 == 0) {
        _Var2 = tailmatch(pcVar13,local_470);
        if (!_Var2) goto LAB_0055cea4;
      }
      else {
        iVar4 = strcmp(pcVar13,local_470);
        if (iVar4 != 0) {
LAB_0055cea4:
          Curl_infof(data,"skipped cookie with bad tailmatch domain: %s\n",pcVar13);
          bVar21 = true;
          goto LAB_0055cf70;
        }
      }
    }
    (*Curl_cfree)(pCVar6->domain);
    pcVar13 = (*Curl_cstrdup)(pcVar13);
    pCVar6->domain = pcVar13;
    if ((pcVar13 != (char *)0x0) && (iVar3 == 0)) {
      pCVar6->tailmatch = true;
      goto LAB_0055cf70;
    }
LAB_0055cf67:
    if (pcVar13 != (char *)0x0) goto LAB_0055cf70;
    bVar20 = true;
LAB_0055d20c:
    pcVar8 = pCVar6->maxage;
    if (pcVar8 == (char *)0x0) {
LAB_0055d5a9:
      if (pCVar6->expirestr != (char *)0x0) {
        tVar14 = curl_getdate(pCVar6->expirestr,(time_t *)0x0);
        pCVar6->expires = tVar14;
        if (tVar14 == 0) {
          pCVar6->expires = 1;
        }
        else if (tVar14 < 0) {
          pCVar6->expires = 0;
        }
      }
    }
    else {
      lVar12 = strtol(pcVar8 + (*pcVar8 == '\"'),(char **)0x0,10);
      pCVar6->expires = lVar12;
      if (0x7fffffffffffffff - tVar5 < lVar12) {
        pCVar6->expires = 0x7fffffffffffffff;
      }
      else {
        pCVar6->expires = lVar12 + tVar5;
      }
    }
    bVar21 = bVar20;
    if (((!bVar20) && (pCVar6->domain == (char *)0x0)) && (local_470 != (char *)0x0)) {
      pcVar8 = (*Curl_cstrdup)(local_470);
      pCVar6->domain = pcVar8;
      bVar21 = true;
      if (pcVar8 != (char *)0x0) {
        bVar21 = bVar20;
      }
    }
    if (((!bVar21) && (path != (char *)0x0)) && (pCVar6->path == (char *)0x0)) {
      pcVar8 = strchr(path,0x3f);
      if (pcVar8 == (char *)0x0) {
        pcVar8 = strrchr(path,0x2f);
      }
      else {
        pcVar8 = (char *)Curl_memrchr(path,0x2f,(long)pcVar8 - (long)path);
      }
      if (pcVar8 != (char *)0x0) {
        pcVar13 = (char *)(*Curl_cmalloc)((size_t)(pcVar8 + (2 - (long)path)));
        pCVar6->path = pcVar13;
        if (pcVar13 == (char *)0x0) {
          (*Curl_cfree)(pcVar7);
          goto LAB_0055d57f;
        }
        memcpy(pcVar13,path,(size_t)(pcVar8 + (1 - (long)path)));
        pCVar6->path[(long)(pcVar8 + (1 - (long)path))] = '\0';
        pcVar8 = sanitize_cookie_path(pCVar6->path);
        pCVar6->spath = pcVar8;
        bVar21 = pcVar8 == (char *)0x0;
      }
    }
    (*Curl_cfree)(pcVar7);
    if ((bVar21) || (pCVar6->name == (char *)0x0)) goto LAB_0055d57f;
  }
  else {
    name[0] = '\0';
    name[1] = '\0';
    name[2] = '\0';
    name[3] = '\0';
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    iVar3 = strncmp(lineptr,"#HttpOnly_",10);
    if (iVar3 == 0) {
      lineptr = lineptr + 10;
      pCVar6->httponly = true;
    }
    if (*lineptr == '#') goto LAB_0055cbfd;
    pcVar7 = strchr(lineptr,0xd);
    if (pcVar7 != (char *)0x0) {
      *pcVar7 = '\0';
    }
    pcVar7 = strchr(lineptr,10);
    if (pcVar7 != (char *)0x0) {
      *pcVar7 = '\0';
    }
    pcVar7 = strtok_r(lineptr,"\t",(char **)name);
    if (pcVar7 == (char *)0x0) goto LAB_0055d57f;
    uVar19 = 0;
    bVar20 = false;
    bVar21 = false;
    do {
      switch(uVar19) {
      case 0:
        pcVar7 = (*Curl_cstrdup)(pcVar7 + (*pcVar7 == '.'));
        pCVar6->domain = pcVar7;
        if (pcVar7 == (char *)0x0) {
          bVar20 = true;
        }
        uVar19 = 0;
        bVar21 = bVar20;
        break;
      case 1:
        iVar3 = Curl_strcasecompare(pcVar7,"TRUE");
        pCVar6->tailmatch = iVar3 != 0;
        uVar19 = 1;
        break;
      case 2:
        iVar3 = strcmp("TRUE",pcVar7);
        if ((iVar3 == 0) || (iVar3 = strcmp("FALSE",pcVar7), iVar3 == 0)) {
          pcVar8 = (*Curl_cstrdup)("/");
          pCVar6->path = pcVar8;
          pcVar13 = (*Curl_cstrdup)("/");
          if (pcVar8 == (char *)0x0) {
            bVar20 = true;
          }
          pCVar6->spath = pcVar13;
          bVar21 = bVar20;
          if (pcVar13 == (char *)0x0) {
            bVar20 = true;
            bVar21 = true;
          }
          goto switchD_0055d04c_caseD_3;
        }
        pcVar7 = (*Curl_cstrdup)(pcVar7);
        pCVar6->path = pcVar7;
        uVar19 = 2;
        if (pcVar7 == (char *)0x0) {
          bVar21 = true;
          bVar20 = true;
        }
        else {
          pcVar7 = sanitize_cookie_path(pcVar7);
          pCVar6->spath = pcVar7;
          bVar21 = bVar20;
          if (pcVar7 == (char *)0x0) {
            bVar21 = true;
            bVar20 = bVar21;
          }
        }
        break;
      case 3:
switchD_0055d04c_caseD_3:
        iVar3 = Curl_strcasecompare(pcVar7,"TRUE");
        pCVar6->secure = iVar3 != 0;
        uVar19 = 3;
        break;
      case 4:
        lVar12 = strtol(pcVar7,(char **)0x0,10);
        pCVar6->expires = lVar12;
        uVar19 = 4;
        break;
      case 5:
        pcVar7 = (*Curl_cstrdup)(pcVar7);
        pCVar6->name = pcVar7;
        if (pcVar7 == (char *)0x0) {
          bVar20 = true;
        }
        uVar19 = 5;
        bVar21 = bVar20;
        break;
      case 6:
        pcVar7 = (*Curl_cstrdup)(pcVar7);
        pCVar6->value = pcVar7;
        if (pcVar7 == (char *)0x0) {
          bVar20 = true;
        }
        uVar19 = 6;
        bVar21 = bVar20;
      }
      pcVar7 = strtok_r((char *)0x0,"\t",(char **)name);
      uVar19 = uVar19 + 1;
    } while ((pcVar7 != (char *)0x0) && (!bVar21));
    if (uVar19 == 6) {
      pcVar7 = (*Curl_cstrdup)("");
      pCVar6->value = pcVar7;
      bVar20 = true;
      if (pcVar7 != (char *)0x0) {
        bVar20 = bVar21;
      }
      bVar21 = bVar20;
      uVar19 = pcVar7 == (char *)0x0 ^ 7;
    }
    if ((bVar21) || (uVar19 != 7)) goto LAB_0055d57f;
  }
  if ((c->running != false) || ((c->newsession != true || (pCVar6->expires != 0)))) {
    pCVar6->livecookie = c->running;
    remove_expired(c);
    if (c->cookies == (Cookie *)0x0) {
      bVar21 = false;
      pCVar18 = (Cookie *)0x0;
    }
    else {
      bVar21 = false;
      pCVar16 = c->cookies;
      do {
        pCVar18 = pCVar16;
        iVar3 = Curl_strcasecompare(pCVar18->name,pCVar6->name);
        if (iVar3 != 0) {
          pcVar7 = pCVar6->domain;
          if (pCVar18->domain == (char *)0x0) {
            bVar20 = pcVar7 == (char *)0x0;
LAB_0055d387:
            if (bVar20) {
              bVar21 = true;
            }
          }
          else if ((pcVar7 != (char *)0x0) &&
                  (iVar3 = Curl_strcasecompare(pCVar18->domain,pcVar7), iVar3 != 0)) {
            bVar20 = pCVar18->tailmatch == pCVar6->tailmatch;
            goto LAB_0055d387;
          }
          if (bVar21) {
            pcVar7 = pCVar6->spath;
            if (pCVar18->spath == (char *)0x0) {
              if (pcVar7 != (char *)0x0) {
LAB_0055d3be:
                bVar21 = false;
                goto LAB_0055d3c1;
              }
            }
            else if ((pcVar7 == (char *)0x0) ||
                    (iVar3 = Curl_strcasecompare(pCVar18->spath,pcVar7), iVar3 == 0))
            goto LAB_0055d3be;
            if ((pCVar6->livecookie != false) || (pCVar18->livecookie != true)) {
              pCVar6->next = pCVar18->next;
              (*Curl_cfree)(pCVar18->name);
              (*Curl_cfree)(pCVar18->value);
              (*Curl_cfree)(pCVar18->domain);
              (*Curl_cfree)(pCVar18->path);
              (*Curl_cfree)(pCVar18->spath);
              (*Curl_cfree)(pCVar18->expirestr);
              (*Curl_cfree)(pCVar18->version);
              (*Curl_cfree)(pCVar18->maxage);
              pCVar16 = pCVar6;
              pCVar17 = pCVar18;
              for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
                pCVar17->next = pCVar16->next;
                pCVar16 = (Cookie *)((long)pCVar16 + (ulong)bVar22 * -0x10 + 8);
                pCVar17 = (Cookie *)((long)pCVar17 + (ulong)bVar22 * -0x10 + 8);
              }
              (*Curl_cfree)(pCVar6);
              pCVar6 = pCVar18;
              do {
                pCVar16 = pCVar6;
                pCVar6 = pCVar16->next;
              } while (pCVar6 != (Cookie *)0x0);
              bVar21 = true;
              pCVar6 = pCVar18;
              pCVar18 = pCVar16;
              break;
            }
            goto LAB_0055d57f;
          }
        }
LAB_0055d3c1:
        pCVar16 = pCVar18->next;
      } while (pCVar18->next != (Cookie *)0x0);
    }
    if (c->running != false) {
      pcVar7 = "Added";
      if (bVar21) {
        pcVar7 = "Replaced";
      }
      Curl_infof(data,"%s cookie %s=\"%s\" for domain %s, path %s, expire %ld\n",pcVar7,pCVar6->name
                 ,pCVar6->value,pCVar6->domain,pCVar6->path,pCVar6->expires);
    }
    if (!bVar21) {
      if (pCVar18 == (Cookie *)0x0) {
        pCVar18 = (Cookie *)c;
      }
      pCVar18->next = pCVar6;
      c->numcookies = c->numcookies + 1;
      return pCVar6;
    }
    return pCVar6;
  }
LAB_0055d57f:
  freecookie(pCVar6);
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *
Curl_cookie_add(struct Curl_easy *data,
                /* The 'data' pointer here may be NULL at times, and thus
                   must only be used very carefully for things that can deal
                   with data being NULL. Such as infof() and similar */

                struct CookieInfo *c,
                bool httpheader, /* TRUE if HTTP header-style line */
                char *lineptr,   /* first character of the line */
                const char *domain, /* default domain */
                const char *path)   /* full path used when this cookie is set,
                                       used to get default path for the cookie
                                       unless set */
{
  struct Cookie *clist;
  char name[MAX_NAME];
  struct Cookie *co;
  struct Cookie *lastc=NULL;
  time_t now = time(NULL);
  bool replace_old = FALSE;
  bool badcookie = FALSE; /* cookies are good by default. mmmmm yummy */

#ifdef USE_LIBPSL
  const psl_ctx_t *psl;
#endif

#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif

  /* First, alloc and init a new struct for it */
  co = calloc(1, sizeof(struct Cookie));
  if(!co)
    return NULL; /* bail out if we're this low on memory */

  if(httpheader) {
    /* This line was read off a HTTP-header */
    const char *ptr;
    const char *semiptr;
    char *what;

    what = malloc(MAX_COOKIE_LINE);
    if(!what) {
      free(co);
      return NULL;
    }

    semiptr=strchr(lineptr, ';'); /* first, find a semicolon */

    while(*lineptr && ISBLANK(*lineptr))
      lineptr++;

    ptr = lineptr;
    do {
      /* we have a <what>=<this> pair or a stand-alone word here */
      name[0]=what[0]=0; /* init the buffers */
      if(1 <= sscanf(ptr, "%" MAX_NAME_TXT "[^;\r\n=] =%"
                     MAX_COOKIE_LINE_TXT "[^;\r\n]",
                     name, what)) {
        /* Use strstore() below to properly deal with received cookie
           headers that have the same string property set more than once,
           and then we use the last one. */
        const char *whatptr;
        bool done = FALSE;
        bool sep;
        size_t len=strlen(what);
        size_t nlen = strlen(name);
        const char *endofn = &ptr[ nlen ];

        /* name ends with a '=' ? */
        sep = (*endofn == '=')?TRUE:FALSE;

        if(nlen) {
          endofn--; /* move to the last character */
          if(ISBLANK(*endofn)) {
            /* skip trailing spaces in name */
            while(*endofn && ISBLANK(*endofn) && nlen) {
              endofn--;
              nlen--;
            }
            name[nlen]=0; /* new end of name */
          }
        }

        /* Strip off trailing whitespace from the 'what' */
        while(len && ISBLANK(what[len-1])) {
          what[len-1]=0;
          len--;
        }

        /* Skip leading whitespace from the 'what' */
        whatptr=what;
        while(*whatptr && ISBLANK(*whatptr))
          whatptr++;

        if(!co->name && sep) {
          /* The very first name/value pair is the actual cookie name */
          co->name = strdup(name);
          co->value = strdup(whatptr);
          if(!co->name || !co->value) {
            badcookie = TRUE;
            break;
          }
        }
        else if(!len) {
          /* this was a "<name>=" with no content, and we must allow
             'secure' and 'httponly' specified this weirdly */
          done = TRUE;
          if(strcasecompare("secure", name))
            co->secure = TRUE;
          else if(strcasecompare("httponly", name))
            co->httponly = TRUE;
          else if(sep)
            /* there was a '=' so we're not done parsing this field */
            done = FALSE;
        }
        if(done)
          ;
        else if(strcasecompare("path", name)) {
          strstore(&co->path, whatptr);
          if(!co->path) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
        }
        else if(strcasecompare("domain", name)) {
          bool is_ip;

          /* Now, we make sure that our host is within the given domain,
             or the given domain is not valid and thus cannot be set. */

          if('.' == whatptr[0])
            whatptr++; /* ignore preceding dot */

#ifndef USE_LIBPSL
          /*
           * Without PSL we don't know when the incoming cookie is set on a
           * TLD or otherwise "protected" suffix. To reduce risk, we require a
           * dot OR the exact host name being "localhost".
           */
          {
            const char *dotp;
            /* check for more dots */
            dotp = strchr(whatptr, '.');
            if(!dotp && !strcasecompare("localhost", whatptr))
              domain=":";
          }
#endif

          is_ip = isip(domain ? domain : whatptr);

          if(!domain
             || (is_ip && !strcmp(whatptr, domain))
             || (!is_ip && tailmatch(whatptr, domain))) {
            strstore(&co->domain, whatptr);
            if(!co->domain) {
              badcookie = TRUE;
              break;
            }
            if(!is_ip)
              co->tailmatch=TRUE; /* we always do that if the domain name was
                                     given */
          }
          else {
            /* we did not get a tailmatch and then the attempted set domain
               is not a domain to which the current host belongs. Mark as
               bad. */
            badcookie=TRUE;
            infof(data, "skipped cookie with bad tailmatch domain: %s\n",
                  whatptr);
          }
        }
        else if(strcasecompare("version", name)) {
          strstore(&co->version, whatptr);
          if(!co->version) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("max-age", name)) {
          /* Defined in RFC2109:

             Optional.  The Max-Age attribute defines the lifetime of the
             cookie, in seconds.  The delta-seconds value is a decimal non-
             negative integer.  After delta-seconds seconds elapse, the
             client should discard the cookie.  A value of zero means the
             cookie should be discarded immediately.

          */
          strstore(&co->maxage, whatptr);
          if(!co->maxage) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("expires", name)) {
          strstore(&co->expirestr, whatptr);
          if(!co->expirestr) {
            badcookie = TRUE;
            break;
          }
        }
        /*
          else this is the second (or more) name we don't know
          about! */
      }
      else {
        /* this is an "illegal" <what>=<this> pair */
      }

      if(!semiptr || !*semiptr) {
        /* we already know there are no more cookies */
        semiptr = NULL;
        continue;
      }

      ptr=semiptr+1;
      while(*ptr && ISBLANK(*ptr))
        ptr++;
      semiptr=strchr(ptr, ';'); /* now, find the next semicolon */

      if(!semiptr && *ptr)
        /* There are no more semicolons, but there's a final name=value pair
           coming up */
        semiptr=strchr(ptr, '\0');
    } while(semiptr);

    if(co->maxage) {
      co->expires =
        curlx_strtoofft((*co->maxage=='\"')?
                        &co->maxage[1]:&co->maxage[0], NULL, 10);
      if(CURL_OFF_T_MAX - now < co->expires)
        /* avoid overflow */
        co->expires = CURL_OFF_T_MAX;
      else
        co->expires += now;
    }
    else if(co->expirestr) {
      /* Note that if the date couldn't get parsed for whatever reason,
         the cookie will be treated as a session cookie */
      co->expires = curl_getdate(co->expirestr, NULL);

      /* Session cookies have expires set to 0 so if we get that back
         from the date parser let's add a second to make it a
         non-session cookie */
      if(co->expires == 0)
        co->expires = 1;
      else if(co->expires < 0)
        co->expires = 0;
    }

    if(!badcookie && !co->domain) {
      if(domain) {
        /* no domain was given in the header line, set the default */
        co->domain=strdup(domain);
        if(!co->domain)
          badcookie = TRUE;
      }
    }

    if(!badcookie && !co->path && path) {
      /* No path was given in the header line, set the default.
         Note that the passed-in path to this function MAY have a '?' and
         following part that MUST not be stored as part of the path. */
      char *queryp = strchr(path, '?');

      /* queryp is where the interesting part of the path ends, so now we
         want to the find the last */
      char *endslash;
      if(!queryp)
        endslash = strrchr(path, '/');
      else
        endslash = memrchr(path, '/', (size_t)(queryp - path));
      if(endslash) {
        size_t pathlen = (size_t)(endslash-path+1); /* include ending slash */
        co->path=malloc(pathlen+1); /* one extra for the zero byte */
        if(co->path) {
          memcpy(co->path, path, pathlen);
          co->path[pathlen]=0; /* zero terminate */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath)
            badcookie = TRUE; /* out of memory bad */
        }
        else
          badcookie = TRUE;
      }
    }

    free(what);

    if(badcookie || !co->name) {
      /* we didn't get a cookie name or a bad one,
         this is an illegal line, bail out */
      freecookie(co);
      return NULL;
    }

  }
  else {
    /* This line is NOT a HTTP header style line, we do offer support for
       reading the odd netscape cookies-file format here */
    char *ptr;
    char *firstptr;
    char *tok_buf=NULL;
    int fields;

    /* IE introduced HTTP-only cookies to prevent XSS attacks. Cookies
       marked with httpOnly after the domain name are not accessible
       from javascripts, but since curl does not operate at javascript
       level, we include them anyway. In Firefox's cookie files, these
       lines are preceded with #HttpOnly_ and then everything is
       as usual, so we skip 10 characters of the line..
    */
    if(strncmp(lineptr, "#HttpOnly_", 10) == 0) {
      lineptr += 10;
      co->httponly = TRUE;
    }

    if(lineptr[0]=='#') {
      /* don't even try the comments */
      free(co);
      return NULL;
    }
    /* strip off the possible end-of-line characters */
    ptr=strchr(lineptr, '\r');
    if(ptr)
      *ptr=0; /* clear it */
    ptr=strchr(lineptr, '\n');
    if(ptr)
      *ptr=0; /* clear it */

    firstptr=strtok_r(lineptr, "\t", &tok_buf); /* tokenize it on the TAB */

    /* Now loop through the fields and init the struct we already have
       allocated */
    for(ptr=firstptr, fields=0; ptr && !badcookie;
        ptr=strtok_r(NULL, "\t", &tok_buf), fields++) {
      switch(fields) {
      case 0:
        if(ptr[0]=='.') /* skip preceding dots */
          ptr++;
        co->domain = strdup(ptr);
        if(!co->domain)
          badcookie = TRUE;
        break;
      case 1:
        /* This field got its explanation on the 23rd of May 2001 by
           Andr�s Garc�a:

           flag: A TRUE/FALSE value indicating if all machines within a given
           domain can access the variable. This value is set automatically by
           the browser, depending on the value you set for the domain.

           As far as I can see, it is set to true when the cookie says
           .domain.com and to false when the domain is complete www.domain.com
        */
        co->tailmatch = strcasecompare(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 2:
        /* It turns out, that sometimes the file format allows the path
           field to remain not filled in, we try to detect this and work
           around it! Andr�s Garc�a made us aware of this... */
        if(strcmp("TRUE", ptr) && strcmp("FALSE", ptr)) {
          /* only if the path doesn't look like a boolean option! */
          co->path = strdup(ptr);
          if(!co->path)
            badcookie = TRUE;
          else {
            co->spath = sanitize_cookie_path(co->path);
            if(!co->spath) {
              badcookie = TRUE; /* out of memory bad */
            }
          }
          break;
        }
        /* this doesn't look like a path, make one up! */
        co->path = strdup("/");
        if(!co->path)
          badcookie = TRUE;
        co->spath = strdup("/");
        if(!co->spath)
          badcookie = TRUE;
        fields++; /* add a field and fall down to secure */
        /* FALLTHROUGH */
      case 3:
        co->secure = strcasecompare(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 4:
        co->expires = curlx_strtoofft(ptr, NULL, 10);
        break;
      case 5:
        co->name = strdup(ptr);
        if(!co->name)
          badcookie = TRUE;
        break;
      case 6:
        co->value = strdup(ptr);
        if(!co->value)
          badcookie = TRUE;
        break;
      }
    }
    if(6 == fields) {
      /* we got a cookie with blank contents, fix it */
      co->value = strdup("");
      if(!co->value)
        badcookie = TRUE;
      else
        fields++;
    }

    if(!badcookie && (7 != fields))
      /* we did not find the sufficient number of fields */
      badcookie = TRUE;

    if(badcookie) {
      freecookie(co);
      return NULL;
    }

  }

  if(!c->running &&    /* read from a file */
     c->newsession &&  /* clean session cookies */
     !co->expires) {   /* this is a session cookie since it doesn't expire! */
    freecookie(co);
    return NULL;
  }

  co->livecookie = c->running;

  /* now, we have parsed the incoming line, we must now check if this
     superceeds an already existing cookie, which it may if the previous have
     the same domain and path as this */

  /* at first, remove expired cookies */
  remove_expired(c);

#ifdef USE_LIBPSL
  /* Check if the domain is a Public Suffix and if yes, ignore the cookie.
     This needs a libpsl compiled with builtin data. */
  if(domain && co->domain && !isip(co->domain)) {
    psl = psl_builtin();
    if(psl && !psl_is_cookie_domain_acceptable(psl, domain, co->domain)) {
      infof(data,
            "cookie '%s' dropped, domain '%s' must not set cookies for '%s'\n",
            co->name, domain, co->domain);
      freecookie(co);
      return NULL;
    }
  }
#endif

  clist = c->cookies;
  replace_old = FALSE;
  while(clist) {
    if(strcasecompare(clist->name, co->name)) {
      /* the names are identical */

      if(clist->domain && co->domain) {
        if(strcasecompare(clist->domain, co->domain) &&
          (clist->tailmatch == co->tailmatch))
          /* The domains are identical */
          replace_old=TRUE;
      }
      else if(!clist->domain && !co->domain)
        replace_old = TRUE;

      if(replace_old) {
        /* the domains were identical */

        if(clist->spath && co->spath) {
          if(strcasecompare(clist->spath, co->spath)) {
            replace_old = TRUE;
          }
          else
            replace_old = FALSE;
        }
        else if(!clist->spath && !co->spath)
          replace_old = TRUE;
        else
          replace_old = FALSE;

      }

      if(replace_old && !co->livecookie && clist->livecookie) {
        /* Both cookies matched fine, except that the already present
           cookie is "live", which means it was set from a header, while
           the new one isn't "live" and thus only read from a file. We let
           live cookies stay alive */

        /* Free the newcomer and get out of here! */
        freecookie(co);
        return NULL;
      }

      if(replace_old) {
        co->next = clist->next; /* get the next-pointer first */

        /* then free all the old pointers */
        free(clist->name);
        free(clist->value);
        free(clist->domain);
        free(clist->path);
        free(clist->spath);
        free(clist->expirestr);
        free(clist->version);
        free(clist->maxage);

        *clist = *co;  /* then store all the new data */

        free(co);   /* free the newly alloced memory */
        co = clist; /* point to the previous struct instead */

        /* We have replaced a cookie, now skip the rest of the list but
           make sure the 'lastc' pointer is properly set */
        do {
          lastc = clist;
          clist = clist->next;
        } while(clist);
        break;
      }
    }
    lastc = clist;
    clist = clist->next;
  }

  if(c->running)
    /* Only show this when NOT reading the cookies from a file */
    infof(data, "%s cookie %s=\"%s\" for domain %s, path %s, "
          "expire %" CURL_FORMAT_CURL_OFF_T "\n",
          replace_old?"Replaced":"Added", co->name, co->value,
          co->domain, co->path, co->expires);

  if(!replace_old) {
    /* then make the last item point on this new one */
    if(lastc)
      lastc->next = co;
    else
      c->cookies = co;
    c->numcookies++; /* one more cookie in the jar */
  }

  return co;
}